

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamio.c
# Opt level: O1

StreamOut * prvTidyUserOutput(TidyDocImpl *doc,TidyOutputSink *sink,int encoding,uint nl)

{
  TidyPutByteFunc p_Var1;
  StreamOut *pSVar2;
  
  pSVar2 = (StreamOut *)(*doc->allocator->vtbl->alloc)(doc->allocator,0x20);
  pSVar2->encoding = 0;
  pSVar2->state = FSM_ASCII;
  pSVar2->nl = 0;
  pSVar2->iotype = FileIO;
  (pSVar2->sink).sinkData = (void *)0x0;
  (pSVar2->sink).putByte = (TidyPutByteFunc)0x0;
  pSVar2->encoding = encoding;
  pSVar2->state = FSM_ASCII;
  pSVar2->nl = nl;
  p_Var1 = sink->putByte;
  (pSVar2->sink).sinkData = sink->sinkData;
  (pSVar2->sink).putByte = p_Var1;
  pSVar2->iotype = UserIO;
  return pSVar2;
}

Assistant:

StreamOut* TY_(UserOutput)( TidyDocImpl *doc, TidyOutputSink* sink, int encoding, uint nl )
{
    StreamOut* out = initStreamOut( doc, encoding, nl );
    memcpy( &out->sink, sink, sizeof(TidyOutputSink) );
    out->iotype = UserIO;
    return out;
}